

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void gc_mark(global_State *g,GCobj *o)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  global_State *in_RSI;
  long in_RDI;
  GCupval *uv;
  GCtab *mt;
  int gct;
  undefined4 in_stack_ffffffffffffffe8;
  global_State *pgVar4;
  
  bVar1 = *(byte *)((long)&in_RSI->strhash + 5);
  uVar2 = (uint)bVar1;
  *(byte *)((long)&in_RSI->strhash + 4) = *(byte *)((long)&in_RSI->strhash + 4) & 0xfc;
  if (uVar2 == 0xc) {
    uVar3 = (ulong)(uint)(in_RSI->strbloom).cur[0];
    *(byte *)((long)&in_RSI->strhash + 4) = *(byte *)((long)&in_RSI->strhash + 4) | 4;
    if ((uVar3 != 0) && ((*(byte *)(uVar3 + 4) & 3) != 0)) {
      gc_mark(in_RSI,(GCobj *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffe8));
    }
    if ((*(byte *)((ulong)in_RSI->strmask + 4) & 3) != 0) {
      gc_mark(in_RSI,(GCobj *)CONCAT44(uVar2,in_stack_ffffffffffffffe8));
    }
  }
  else if (uVar2 == 5) {
    pgVar4 = in_RSI;
    if ((0xfffffff6 < *(int *)((ulong)(uint)(in_RSI->strbloom).cur[0] + 4) + 4U) &&
       ((*(byte *)((ulong)*(uint *)(ulong)(uint)(in_RSI->strbloom).cur[0] + 4) & 3) != 0)) {
      gc_mark(in_RSI,(GCobj *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffe8));
    }
    if (*(char *)((long)&in_RSI->strhash + 6) != '\0') {
      *(byte *)((long)&pgVar4->strhash + 4) = *(byte *)((long)&pgVar4->strhash + 4) | 4;
    }
  }
  else if ((uVar2 != 4) && (uVar2 != 10)) {
    in_RSI->strnum = *(MSize *)(in_RDI + 0x68);
    *(int *)(in_RDI + 0x68) = (int)in_RSI;
  }
  return;
}

Assistant:

static void gc_mark(global_State *g, GCobj *o)
{
  int gct = o->gch.gct;
  lj_assertG(iswhite(o), "mark of non-white object");
  lj_assertG(!isdead(g, o), "mark of dead object");
  white2gray(o);
  if (LJ_UNLIKELY(gct == ~LJ_TUDATA)) {
    GCtab *mt = tabref(gco2ud(o)->metatable);
    gray2black(o);  /* Userdata are never gray. */
    if (mt) gc_markobj(g, mt);
    gc_markobj(g, tabref(gco2ud(o)->env));
  } else if (LJ_UNLIKELY(gct == ~LJ_TUPVAL)) {
    GCupval *uv = gco2uv(o);
    gc_marktv(g, uvval(uv));
    if (uv->closed)
      gray2black(o);  /* Closed upvalues are never gray. */
  } else if (gct != ~LJ_TSTR && gct != ~LJ_TCDATA) {
    lj_assertG(gct == ~LJ_TFUNC || gct == ~LJ_TTAB ||
	       gct == ~LJ_TTHREAD || gct == ~LJ_TPROTO || gct == ~LJ_TTRACE,
	       "bad GC type %d", gct);
    setgcrefr(o->gch.gclist, g->gc.gray);
    setgcref(g->gc.gray, o);
  }
}